

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void * worker_thread_test_evict_by_key(void *arg)

{
  int iVar1;
  ulong local_28;
  unsigned_long_long n;
  void *pvStack_18;
  uint n_threads;
  context *ctx;
  void *arg_local;
  
  n._4_4_ = *(uint *)((long)arg + 4);
  pvStack_18 = arg;
  ctx = (context *)arg;
  for (local_28 = 0; local_28 < n._4_4_; local_28 = local_28 + 1) {
    vmemcache_evict(*(undefined8 *)((long)pvStack_18 + 8),&local_28,8);
  }
  do {
    iVar1 = vmemcache_evict(*(undefined8 *)((long)pvStack_18 + 8),0);
  } while (iVar1 == 0);
  LOCK();
  keep_running = 0;
  UNLOCK();
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_test_evict_by_key(void *arg)
{
	struct context *ctx = arg;
	unsigned n_threads = ctx->n_threads;

	/*
	 * Try to evict all entries by key first.
	 * It is very likely that even all of these vmemcache_evict() calls
	 * will fail, because the conditions are extremely difficult (all cache
	 * entries are being constantly read (used) by separate threads),
	 * but this is acceptable, because this test is dedicated
	 * to test the failure path of vmemcache_evict()
	 * and the success criteria of this test are checks done in free_cache()
	 * at the end of the test.
	 */
	for (unsigned long long  n = 0; n < n_threads; ++n)
		vmemcache_evict(ctx->cache, &n, sizeof(n));

	/* try to evict by LRU all entries that were not evicted above */
	while (vmemcache_evict(ctx->cache, NULL, 0) == 0)
		;

	__atomic_store_n(&keep_running, 0, __ATOMIC_SEQ_CST);

	return NULL;
}